

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelinePushConstantTests.cpp
# Opt level: O2

void __thiscall
vkt::pipeline::anon_unknown_1::PushConstantComputeTest::initPrograms
          (PushConstantComputeTest *this,SourceCollections *sourceCollections)

{
  ostream *poVar1;
  ProgramSources *this_00;
  ostringstream computeSrc;
  allocator<char> local_1f1;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [40];
  ostringstream local_188 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar1 = std::operator<<((ostream *)local_188,"#version 450\n");
  poVar1 = std::operator<<(poVar1,
                           "layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n");
  poVar1 = std::operator<<(poVar1,"layout(std140, set = 0, binding = 0) writeonly buffer Output {\n"
                          );
  poVar1 = std::operator<<(poVar1,"  vec4 elements[];\n");
  poVar1 = std::operator<<(poVar1,"} outData;\n");
  poVar1 = std::operator<<(poVar1,"layout(push_constant) uniform Material{\n");
  poVar1 = std::operator<<(poVar1,"  vec4 element;\n");
  poVar1 = std::operator<<(poVar1,"} matInst;\n");
  poVar1 = std::operator<<(poVar1,"void main (void)\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<(poVar1,"  outData.elements[gl_GlobalInvocationID.x] = matInst.element;\n"
                          );
  std::operator<<(poVar1,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"compute",&local_1f1);
  this_00 = ::vk::ProgramCollection<glu::ProgramSources>::add
                      (&sourceCollections->glslSources,&local_1d0);
  std::__cxx11::stringbuf::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)local_1b0,&local_1f0);
  glu::ProgramSources::operator<<(this_00,(ShaderSource *)local_1b0);
  std::__cxx11::string::~string((string *)(local_1b0 + 8));
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return;
}

Assistant:

void PushConstantComputeTest::initPrograms (SourceCollections& sourceCollections) const
{
	std::ostringstream	computeSrc;

	computeSrc << "#version 450\n"
			   << "layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
			   << "layout(std140, set = 0, binding = 0) writeonly buffer Output {\n"
			   << "  vec4 elements[];\n"
			   << "} outData;\n"
			   << "layout(push_constant) uniform Material{\n"
			   << "  vec4 element;\n"
			   << "} matInst;\n"
			   << "void main (void)\n"
			   << "{\n"
			   << "  outData.elements[gl_GlobalInvocationID.x] = matInst.element;\n"
			   << "}\n";

	sourceCollections.glslSources.add("compute") << glu::ComputeSource(computeSrc.str());
}